

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# des.c
# Opt level: O0

int mbedtls_des3_crypt_ecb(mbedtls_des3_context *ctx,uchar *input,uchar *output)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint32_t *puVar4;
  uint32_t *local_38;
  uint32_t *SK;
  uint32_t T;
  uint32_t Y;
  uint32_t X;
  int i;
  uchar *output_local;
  uchar *input_local;
  mbedtls_des3_context *ctx_local;
  
  uVar1 = (uint)*input << 0x18 | (uint)input[1] << 0x10 | (uint)input[2] << 8 | (uint)input[3];
  uVar2 = (uint)input[4] << 0x18 | (uint)input[5] << 0x10 | (uint)input[6] << 8 | (uint)input[7];
  uVar3 = (uVar1 >> 4 ^ uVar2) & 0xf0f0f0f;
  uVar2 = uVar3 ^ uVar2;
  uVar1 = uVar3 << 4 ^ uVar1;
  uVar3 = (uVar1 >> 0x10 ^ uVar2) & 0xffff;
  uVar2 = uVar3 ^ uVar2;
  uVar1 = uVar3 << 0x10 ^ uVar1;
  uVar3 = (uVar2 >> 2 ^ uVar1) & 0x33333333;
  uVar1 = uVar3 ^ uVar1;
  uVar2 = uVar3 << 2 ^ uVar2;
  uVar3 = (uVar2 >> 8 ^ uVar1) & 0xff00ff;
  uVar1 = uVar3 ^ uVar1;
  uVar2 = uVar3 << 8 ^ uVar2;
  uVar3 = uVar2 << 1 | uVar2 >> 0x1f;
  uVar2 = (uVar1 ^ uVar3) & 0xaaaaaaaa;
  SK._4_4_ = uVar2 ^ uVar3;
  uVar2 = uVar2 ^ uVar1;
  T = uVar2 << 1 | uVar2 >> 0x1f;
  Y = 0;
  local_38 = ctx->sk;
  for (; (int)Y < 8; Y = Y + 1) {
    uVar3 = *local_38 ^ SK._4_4_;
    uVar1 = local_38[1] ^ (SK._4_4_ << 0x1c | SK._4_4_ >> 4);
    T = SB7[uVar1 & 0x3f] ^ SB5[uVar1 >> 8 & 0x3f] ^ SB3[uVar1 >> 0x10 & 0x3f] ^
        SB1[uVar1 >> 0x18 & 0x3f] ^
        SB8[uVar3 & 0x3f] ^ SB6[uVar3 >> 8 & 0x3f] ^ SB4[uVar3 >> 0x10 & 0x3f] ^
        SB2[uVar3 >> 0x18 & 0x3f] ^ T;
    puVar4 = local_38 + 3;
    uVar3 = local_38[2] ^ T;
    local_38 = local_38 + 4;
    uVar1 = *puVar4 ^ (T << 0x1c | T >> 4);
    SK._4_4_ = SB7[uVar1 & 0x3f] ^ SB5[uVar1 >> 8 & 0x3f] ^ SB3[uVar1 >> 0x10 & 0x3f] ^
               SB1[uVar1 >> 0x18 & 0x3f] ^
               SB8[uVar3 & 0x3f] ^ SB6[uVar3 >> 8 & 0x3f] ^ SB4[uVar3 >> 0x10 & 0x3f] ^
               SB2[uVar3 >> 0x18 & 0x3f] ^ SK._4_4_;
  }
  for (Y = 0; (int)Y < 8; Y = Y + 1) {
    uVar3 = *local_38 ^ T;
    uVar1 = local_38[1] ^ (T << 0x1c | T >> 4);
    SK._4_4_ = SB7[uVar1 & 0x3f] ^ SB5[uVar1 >> 8 & 0x3f] ^ SB3[uVar1 >> 0x10 & 0x3f] ^
               SB1[uVar1 >> 0x18 & 0x3f] ^
               SB8[uVar3 & 0x3f] ^ SB6[uVar3 >> 8 & 0x3f] ^ SB4[uVar3 >> 0x10 & 0x3f] ^
               SB2[uVar3 >> 0x18 & 0x3f] ^ SK._4_4_;
    puVar4 = local_38 + 3;
    uVar3 = local_38[2] ^ SK._4_4_;
    local_38 = local_38 + 4;
    uVar1 = *puVar4 ^ (SK._4_4_ << 0x1c | SK._4_4_ >> 4);
    T = SB7[uVar1 & 0x3f] ^ SB5[uVar1 >> 8 & 0x3f] ^ SB3[uVar1 >> 0x10 & 0x3f] ^
        SB1[uVar1 >> 0x18 & 0x3f] ^
        SB8[uVar3 & 0x3f] ^ SB6[uVar3 >> 8 & 0x3f] ^ SB4[uVar3 >> 0x10 & 0x3f] ^
        SB2[uVar3 >> 0x18 & 0x3f] ^ T;
  }
  for (Y = 0; (int)Y < 8; Y = Y + 1) {
    uVar3 = *local_38 ^ SK._4_4_;
    uVar1 = local_38[1] ^ (SK._4_4_ << 0x1c | SK._4_4_ >> 4);
    T = SB7[uVar1 & 0x3f] ^ SB5[uVar1 >> 8 & 0x3f] ^ SB3[uVar1 >> 0x10 & 0x3f] ^
        SB1[uVar1 >> 0x18 & 0x3f] ^
        SB8[uVar3 & 0x3f] ^ SB6[uVar3 >> 8 & 0x3f] ^ SB4[uVar3 >> 0x10 & 0x3f] ^
        SB2[uVar3 >> 0x18 & 0x3f] ^ T;
    puVar4 = local_38 + 3;
    uVar3 = local_38[2] ^ T;
    local_38 = local_38 + 4;
    uVar1 = *puVar4 ^ (T << 0x1c | T >> 4);
    SK._4_4_ = SB7[uVar1 & 0x3f] ^ SB5[uVar1 >> 8 & 0x3f] ^ SB3[uVar1 >> 0x10 & 0x3f] ^
               SB1[uVar1 >> 0x18 & 0x3f] ^
               SB8[uVar3 & 0x3f] ^ SB6[uVar3 >> 8 & 0x3f] ^ SB4[uVar3 >> 0x10 & 0x3f] ^
               SB2[uVar3 >> 0x18 & 0x3f] ^ SK._4_4_;
  }
  uVar2 = SK._4_4_ << 0x1f | SK._4_4_ >> 1;
  uVar3 = (uVar2 ^ T) & 0xaaaaaaaa;
  uVar2 = uVar3 ^ uVar2;
  uVar1 = T << 0x1f | (uVar3 ^ T) >> 1;
  uVar3 = (uVar1 >> 8 ^ uVar2) & 0xff00ff;
  uVar2 = uVar3 ^ uVar2;
  uVar1 = uVar3 << 8 ^ uVar1;
  uVar3 = (uVar1 >> 2 ^ uVar2) & 0x33333333;
  uVar2 = uVar3 ^ uVar2;
  uVar1 = uVar3 << 2 ^ uVar1;
  uVar3 = (uVar2 >> 0x10 ^ uVar1) & 0xffff;
  uVar1 = uVar3 ^ uVar1;
  uVar2 = uVar3 << 0x10 ^ uVar2;
  uVar3 = (uVar2 >> 4 ^ uVar1) & 0xf0f0f0f;
  uVar1 = uVar3 ^ uVar1;
  uVar2 = uVar3 << 4 ^ uVar2;
  *output = (uchar)(uVar2 >> 0x18);
  output[1] = (uchar)(uVar2 >> 0x10);
  output[2] = (uchar)(uVar2 >> 8);
  output[3] = (uchar)uVar2;
  output[4] = (uchar)(uVar1 >> 0x18);
  output[5] = (uchar)(uVar1 >> 0x10);
  output[6] = (uchar)(uVar1 >> 8);
  output[7] = (uchar)uVar1;
  return 0;
}

Assistant:

int mbedtls_des3_crypt_ecb( mbedtls_des3_context *ctx,
                     const unsigned char input[8],
                     unsigned char output[8] )
{
    int i;
    uint32_t X, Y, T, *SK;

    SK = ctx->sk;

    GET_UINT32_BE( X, input, 0 );
    GET_UINT32_BE( Y, input, 4 );

    DES_IP( X, Y );

    for( i = 0; i < 8; i++ )
    {
        DES_ROUND( Y, X );
        DES_ROUND( X, Y );
    }

    for( i = 0; i < 8; i++ )
    {
        DES_ROUND( X, Y );
        DES_ROUND( Y, X );
    }

    for( i = 0; i < 8; i++ )
    {
        DES_ROUND( Y, X );
        DES_ROUND( X, Y );
    }

    DES_FP( Y, X );

    PUT_UINT32_BE( Y, output, 0 );
    PUT_UINT32_BE( X, output, 4 );

    return( 0 );
}